

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_52dd::TlbExportVisitor::visit_(TlbExportVisitor *this,Compound *type)

{
  string *current;
  ostream *poVar1;
  Type *type_00;
  Indent indenter;
  Indent local_90;
  string local_68;
  string local_48;
  
  poVar1 = std::operator<<(this->m_stream,"<compound name=\"");
  Typelib::Type::getName_abi_cxx11_();
  xmlEscape((string *)&local_90,&local_48);
  poVar1 = std::operator<<(poVar1,(string *)&local_90);
  poVar1 = std::operator<<(poVar1,"\" size=\"");
  Typelib::Type::getSize();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\" ");
  (anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_(&local_68,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  std::operator<<(poVar1,">\n");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_48);
  current = &this->m_indent;
  Indent::Indent(&local_90,current);
  Typelib::TypeVisitor::visit_((Compound *)this);
  Indent::~Indent(&local_90);
  poVar1 = std::operator<<(this->m_stream,(string *)current);
  (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_((string *)&local_90,type,type_00)
  ;
  poVar1 = std::operator<<(poVar1,(string *)&local_90);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_90);
  poVar1 = std::operator<<(this->m_stream,(string *)current);
  std::operator<<(poVar1,"</compound>");
  return true;
}

Assistant:

bool TlbExportVisitor::visit_(Compound const& type)
    {
        m_stream << "<compound name=\"" << xmlEscape(type.getName()) << "\" size=\"" << type.getSize() << "\" " << emitSourceID() << ">\n";

        { Indent indenter(m_indent);
            TypeVisitor::visit_(type);
        }

        m_stream << m_indent << emitMetaData(type) << "\n";
        m_stream << m_indent << "</compound>";

        return true;
    }